

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-feed.c
# Opt level: O0

void CGTFS_Feed(void)

{
  int iVar1;
  greatest_test_res local_10;
  greatest_test_res local_c;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("feed_parsing");
  if (iVar1 == 1) {
    local_c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_c == GREATEST_TEST_RES_PASS) {
      local_c = feed_parsing();
    }
    greatest_test_post(local_c);
  }
  iVar1 = greatest_test_pre("feed_comparison");
  if (iVar1 == 1) {
    local_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_10 == GREATEST_TEST_RES_PASS) {
      local_10 = feed_comparison();
    }
    greatest_test_post(local_10);
  }
  return;
}

Assistant:

SUITE(CGTFS_Feed) {
    RUN_TEST(feed_parsing);
    RUN_TEST(feed_comparison);
}